

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

JavascriptRegExp * Js::JavascriptRegExp::BoxStackInstance(JavascriptRegExp *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *this;
  size_t sVar4;
  Recycler *pRVar5;
  JavascriptRegExp *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x429,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) goto LAB_00d1799c;
    *puVar3 = 0;
  }
  this_00 = *(JavascriptRegExp **)&instance[-1].lastIndexOrFlag;
  if (this_00 == (JavascriptRegExp *)0x0) {
    this = DynamicObject::GetTypeHandler(&instance->super_DynamicObject);
    sVar4 = DynamicTypeHandler::GetInlineSlotsSize(this);
    if (sVar4 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                  ,0x431,"(instance->GetTypeHandler()->GetInlineSlotsSize() == 0)",
                                  "instance->GetTypeHandler()->GetInlineSlotsSize() == 0");
      if (!bVar2) {
LAB_00d1799c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    local_48 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_7e951a3;
    data.filename._0_4_ = 0x432;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_48);
    this_00 = (JavascriptRegExp *)new<Memory::Recycler>(0x40,pRVar5,0x38bbb2);
    JavascriptRegExp(this_00,instance,deepCopy);
    *(JavascriptRegExp **)&instance[-1].lastIndexOrFlag = this_00;
  }
  return this_00;
}

Assistant:

JavascriptRegExp * JavascriptRegExp::BoxStackInstance(JavascriptRegExp * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        // On the stack, the we reserved a pointer before the object as to store the boxed value
        JavascriptRegExp ** boxedInstanceRef = ((JavascriptRegExp **)instance) - 1;
        JavascriptRegExp * boxedInstance = *boxedInstanceRef;
        if (boxedInstance)
        {
            return boxedInstance;
        }
        Assert(instance->GetTypeHandler()->GetInlineSlotsSize() == 0);
        boxedInstance = RecyclerNew(instance->GetRecycler(), JavascriptRegExp, instance, deepCopy);
        *boxedInstanceRef = boxedInstance;
        return boxedInstance;
    }